

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

Vec_Wec_t * Vec_WecAlloc(int nCap)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  
  pVVar1 = (Vec_Wec_t *)malloc(0x10);
  pVVar1->nCap = 0x400;
  pVVar1->nSize = 0;
  pVVar2 = (Vec_Int_t *)calloc(0x400,0x10);
  pVVar1->pArray = pVVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Wec_t * Vec_WecAlloc( int nCap )
{
    Vec_Wec_t * p;
    p = ABC_ALLOC( Vec_Wec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_CALLOC( Vec_Int_t, p->nCap ) : NULL;
    return p;
}